

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O1

void __thiscall
gl4cts::GLSL420Pack::LineContinuationTest::prepareComputShaderSource
          (LineContinuationTest *this,shaderSource *source)

{
  GLuint GVar1;
  pointer psVar2;
  
  GVar1 = (this->m_test_case).m_case;
  psVar2 = (source->m_parts).
           super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
           ._M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::string::_M_replace
            ((ulong)psVar2,0,(char *)(psVar2->m_code)._M_string_length,0x1ac70cf);
  psVar2 = (source->m_parts).
           super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (GVar1 - 0xb < 4) {
    std::__cxx11::string::_M_replace
              ((ulong)(psVar2 + 1),0,(char *)psVar2[1].m_code._M_string_length,0x1ac7354);
    replaceAllCaseTokens
              (this,&((source->m_parts).
                      super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
                      ._M_impl.super__Vector_impl_data._M_start)->m_code);
    psVar2 = (source->m_parts).
             super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
             ._M_impl.super__Vector_impl_data._M_start + 1;
  }
  else {
    std::__cxx11::string::append((char *)psVar2);
    psVar2 = (source->m_parts).
             super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
             ._M_impl.super__Vector_impl_data._M_start;
  }
  replaceAllCaseTokens(this,&psVar2->m_code);
  return;
}

Assistant:

void LineContinuationTest::prepareComputShaderSource(Utils::shaderSource& source)
{
	static const GLchar* shader_template_part_0 =
		"#version 430\n"
		"\n"
		"// Lorem ipsum dolor sit amCOMMENT_CASEet, consectetur adipiscing elit posuere.\n"
		"\n"
		"layout(local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n"
		"\n"
		"/* Lorem ipsum dolor sit amet, conCOMMENT_CASEsectetur adipiscing elit posuere. */\n"
		"\n"
		"writeonly uniform image2D   uni_image;\n"
		"          uniform sampler2D uni_sampler;\n"
		"\n"
		"void funFUNCTION_CASEction(in veTYPE_CASEc4 in_vVARIABLE_CASEalue)\n"
		"{\n"
		"    imageStore(uni_image, ivec2(gl_GlobalInvocationID.xy), inVARIABLE_CASE_value);\n"
		"}\n"
		"\n"
		"#define SET_PREPROCESSOR_INSIDE_CASERESULT(XX) "
		"PREPROCESSOR_BETWEEN_CASEfuncFUNCTION_CASEtion(XPREPROCESSOR_INSIDE_CASEX)\n"
		"NEXT_TO_TERMINATION_CASE\nTERMINATION_CASE";

	static const GLchar* shader_template_part_1 =
		"void main()\n"
		"{\n"
		"    ivec2 coordinates   ASSIGNMENT_BEFORE_OPERATOR_CASE=ASSIGNMENT_AFTER_OPERATOR_CASE "
		"ivec2(gl_GlobalInvocationID.xy + ivec2(16, 16));\n"
		"    vec4 sampled_color = texelFetch(uni_sampler, coordinates, 0 /* lod */);\n"
		"    vec4 result        = vec4(0, 0VECTOR_VARIABLE_INITIALIZER_CASE, 0, 1);\n"
		"\n"
		"    if (vec4(0, 0, 1, 1) == sampled_color)\n"
		"    {\n"
		"        result = vecTYPE_CASE4(VECTOR_VARIABLE_INITIALIZER_CASE0, 1, 0, 1);\n"
		"    }\n"
		"    else\n"
		"    {\n"
		"        result = vec4(coordinates.xy, sampled_color.rg);\n"
		"    }\n"
		"\n"
		"    SET_RESULT(result);"
		"}\n";

	/* Init strings with templates and replace all CASE tokens */
	if (true == isShaderMultipart())
	{
		source.m_parts[0].m_code = shader_template_part_0;
		source.m_parts[1].m_code = shader_template_part_1;

		replaceAllCaseTokens(source.m_parts[0].m_code);
		replaceAllCaseTokens(source.m_parts[1].m_code);
	}
	else
	{
		source.m_parts[0].m_code = shader_template_part_0;
		source.m_parts[0].m_code.append(shader_template_part_1);

		replaceAllCaseTokens(source.m_parts[0].m_code);
	}
}